

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeGridTests.cpp
# Opt level: O2

void __thiscall YeeGridTest2d::SetUp(YeeGridTest2d *this)

{
  Grid<(pica::Dimension)2,_double> *this_00;
  
  (this->origin).x = 3.5;
  (this->origin).y = -8.6;
  (this->step).x = 0.1;
  (this->step).y = 0.2;
  (this->size).x = 5;
  (this->size).y = 6;
  this_00 = (Grid<(pica::Dimension)2,_double> *)operator_new(0x140);
  pica::Grid<(pica::Dimension)2,_double>::Grid(this_00,&this->origin,&this->step,&this->size);
  std::auto_ptr<pica::YeeGrid<(pica::Dimension)2,_double>_>::reset
            (&this->grid,(element_type *)this_00);
  return;
}

Assistant:

virtual void SetUp()
    {
        origin = PositionType(3.5, -8.6);
        step = PositionType(0.1, 0.2);
        size = IndexType(5, 6);
        grid.reset(new GridType(origin, step, size));
    }